

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QRect __thiscall
QPixmapStyle::subElementRect
          (QPixmapStyle *this,SubElement element,QStyleOption *option,QWidget *widget)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect QVar4;
  QPixmapStyleDescriptor *desc;
  QPixmapStylePrivate *d;
  QRect rect;
  QWidget *in_stack_000004a8;
  QStyleOption *in_stack_000004b0;
  SubElement in_stack_000004bc;
  QCommonStyle *in_stack_000004c0;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  LayoutDirection direction;
  undefined1 local_50 [56];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPixmapStyle *)0x40166e);
  if (in_ESI == 0x1a) {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])
               QCommonStyle::subElementRect
                         (in_stack_000004c0,in_stack_000004bc,in_stack_000004b0,in_stack_000004a8);
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
              ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (ControlDescriptor *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    direction = (LayoutDirection)((ulong)local_50 >> 0x20);
    iVar1 = QMargins::left((QMargins *)0x401712);
    iVar2 = QMargins::top((QMargins *)0x401724);
    iVar3 = QMargins::right((QMargins *)0x401736);
    iVar3 = -iVar3;
    QMargins::bottom((QMargins *)0x40174e);
    QRect::adjust((QRect *)CONCAT44(iVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c,
                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
    local_18 = (undefined1  [16])QStyle::visualRect(direction,in_RDI,(QRect *)CONCAT44(iVar3,iVar2))
    ;
    QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x4017b9);
  }
  else {
    local_18 = (undefined1  [16])
               QCommonStyle::subElementRect
                         (in_stack_000004c0,in_stack_000004bc,in_stack_000004b0,in_stack_000004a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar4.x1.m_i = local_18._0_4_;
    QVar4.y1.m_i = local_18._4_4_;
    QVar4.x2.m_i = local_18._8_4_;
    QVar4.y2.m_i = local_18._12_4_;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPixmapStyle::subElementRect(SubElement element, const QStyleOption *option,
                                   const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    switch (element) {
    case SE_LineEditContents:
    {
        QRect rect = QCommonStyle::subElementRect(element, option, widget);
        const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
        rect.adjust(desc.margins.left(), desc.margins.top(),
                    -desc.margins.right(), -desc.margins.bottom());
        rect = visualRect(option->direction, option->rect, rect);
        return rect;
    }
    default: ;
    }

    return QCommonStyle::subElementRect(element, option, widget);
}